

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,TPZGeoEl *gel,H1Family h1fam)

{
  TPZChunkVector<TPZConnect,_10> *this_00;
  long *nelem;
  TPZConnect *this_01;
  undefined4 in_ECX;
  TPZCompMesh *in_RSI;
  TPZRegisterClassId *in_RDI;
  int i;
  long *in_stack_ffffffffffffff90;
  pointer_____offset_0x60___ *this_02;
  int local_4c;
  TPZGeoEl *in_stack_ffffffffffffffb8;
  TPZCompMesh *in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  TPZIntelGen<pzshape::TPZShapePrism> *this_03;
  
  this_03 = (TPZIntelGen<pzshape::TPZShapePrism> *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZIntelGen<pzshape::TPZShapePrism>>(in_RDI,0x21);
  this_02 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02513e58);
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (this_03,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513a40;
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513a40;
  TPZManVector<long,_21>::TPZManVector
            ((TPZManVector<long,_21> *)this_02,(int64_t)(in_RDI + 0x70),in_stack_ffffffffffffff90);
  *(undefined4 *)(in_RDI + 0x138) = in_ECX;
  for (local_4c = 0; local_4c < 0x15; local_4c = local_4c + 1) {
    this_00 = (TPZChunkVector<TPZConnect,_10> *)
              (**(code **)(*(long *)in_RDI + 0x370))(in_RDI,local_4c);
    nelem = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x70),(long)local_4c);
    *nelem = (long)this_00;
    TPZCompMesh::ConnectVec(in_RSI);
    TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x70),(long)local_4c);
    this_01 = TPZChunkVector<TPZConnect,_10>::operator[](this_00,(int64_t)nelem);
    TPZConnect::IncrementElConnected(this_01);
  }
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, TPZGeoEl *gel, const H1Family h1fam) : TPZRegisterClassId(&TPZCompElH1::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel), fh1fam(h1fam){

	for(int i=0;i<TSHAPE::NSides;i++) {
		fConnectIndexes[i] = this->CreateMidSideConnect(i);
		mesh.ConnectVec()[fConnectIndexes[i]].IncrementElConnected();
	}
}